

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

int yaml_document_initialize
              (yaml_document_t *document,yaml_version_directive_t *version_directive,
              yaml_tag_directive_t *tag_directives_start,yaml_tag_directive_t *tag_directives_end,
              int start_implicit,int end_implicit)

{
  yaml_char_t *__ptr;
  int iVar1;
  yaml_node_t *__ptr_00;
  yaml_version_directive_t *__ptr_01;
  size_t sVar2;
  yaml_char_t *pyVar3;
  yaml_char_t *pyVar4;
  yaml_tag_directive_t *pyVar5;
  yaml_tag_directive_t *pyVar6;
  long lVar7;
  yaml_tag_directive_t *pyVar8;
  yaml_mark_t mark;
  yaml_tag_directive_t *local_80;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x423,
                  "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                 );
  }
  if ((tag_directives_start != tag_directives_end) &&
     (tag_directives_start == (yaml_tag_directive_t *)0x0 ||
      tag_directives_end == (yaml_tag_directive_t *)0x0)) {
    __assert_fail("(tag_directives_start && tag_directives_end) || (tag_directives_start == tag_directives_end)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x425,
                  "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                 );
  }
  __ptr_00 = (yaml_node_t *)malloc(0x600);
  if (__ptr_00 == (yaml_node_t *)0x0) {
LAB_001aaeb2:
    iVar1 = 0;
  }
  else {
    if (version_directive == (yaml_version_directive_t *)0x0) {
      __ptr_01 = (yaml_version_directive_t *)0x0;
    }
    else {
      __ptr_01 = (yaml_version_directive_t *)malloc(8);
      if (__ptr_01 == (yaml_version_directive_t *)0x0) {
        free(__ptr_00);
        goto LAB_001aaeb2;
      }
      *__ptr_01 = *version_directive;
    }
    if (tag_directives_start == tag_directives_end) {
      local_80 = (yaml_tag_directive_t *)0x0;
      pyVar5 = (yaml_tag_directive_t *)0x0;
    }
    else {
      local_80 = (yaml_tag_directive_t *)malloc(0x100);
      if (local_80 == (yaml_tag_directive_t *)0x0) {
        pyVar4 = (yaml_char_t *)0x0;
        pyVar3 = (yaml_char_t *)0x0;
        pyVar8 = (yaml_tag_directive_t *)0x0;
        local_80 = (yaml_tag_directive_t *)0x0;
LAB_001aaecf:
        free(__ptr_00);
        if (__ptr_01 != (yaml_version_directive_t *)0x0) {
          free(__ptr_01);
        }
        for (; local_80 != pyVar8; pyVar8 = pyVar8 + -1) {
          __ptr = pyVar8[-1].prefix;
          if (pyVar8[-1].handle != (yaml_char_t *)0x0) {
            free(pyVar8[-1].handle);
          }
          if (__ptr != (yaml_char_t *)0x0) {
            free(__ptr);
          }
        }
        if (local_80 != (yaml_tag_directive_t *)0x0) {
          free(local_80);
        }
        if (pyVar3 != (yaml_char_t *)0x0) {
          free(pyVar3);
        }
        if (pyVar4 == (yaml_char_t *)0x0) {
          return 0;
        }
        free(pyVar4);
        return 0;
      }
      pyVar6 = local_80 + 0x10;
      pyVar8 = local_80;
      do {
        pyVar3 = tag_directives_start->handle;
        if (pyVar3 == (yaml_char_t *)0x0) {
          __assert_fail("tag_directive->handle",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                        ,0x437,
                        "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                       );
        }
        pyVar4 = tag_directives_start->prefix;
        if (pyVar4 == (yaml_char_t *)0x0) {
          __assert_fail("tag_directive->prefix",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                        ,0x438,
                        "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                       );
        }
        sVar2 = strlen((char *)pyVar3);
        iVar1 = yaml_check_utf8(pyVar3,sVar2);
        if (iVar1 == 0) {
LAB_001aaec5:
          pyVar4 = (yaml_char_t *)0x0;
          pyVar3 = (yaml_char_t *)0x0;
          goto LAB_001aaecf;
        }
        sVar2 = strlen((char *)pyVar4);
        iVar1 = yaml_check_utf8(pyVar4,sVar2);
        if (iVar1 == 0) goto LAB_001aaec5;
        pyVar3 = (yaml_char_t *)strdup((char *)pyVar3);
        pyVar4 = (yaml_char_t *)strdup((char *)pyVar4);
        if ((pyVar3 == (yaml_char_t *)0x0) || (pyVar4 == (yaml_char_t *)0x0)) goto LAB_001aaecf;
        if (pyVar8 == pyVar6) {
          lVar7 = (long)pyVar8 - (long)local_80;
          if (0x3ffffffe < lVar7) goto LAB_001aaecf;
          pyVar5 = (yaml_tag_directive_t *)yaml_realloc(local_80,lVar7 * 2);
          if (pyVar5 == (yaml_tag_directive_t *)0x0) goto LAB_001aaecf;
          pyVar8 = (yaml_tag_directive_t *)(lVar7 + (long)pyVar5);
          pyVar6 = (yaml_tag_directive_t *)(lVar7 * 2 + (long)pyVar5);
          local_80 = pyVar5;
        }
        pyVar5 = pyVar8 + 1;
        pyVar8->handle = pyVar3;
        pyVar8->prefix = pyVar4;
        tag_directives_start = tag_directives_start + 1;
        pyVar8 = pyVar5;
      } while (tag_directives_start != tag_directives_end);
    }
    (document->nodes).start = __ptr_00;
    (document->nodes).end = __ptr_00 + 0x10;
    (document->nodes).top = __ptr_00;
    document->version_directive = __ptr_01;
    (document->tag_directives).start = local_80;
    (document->tag_directives).end = pyVar5;
    document->start_implicit = start_implicit;
    document->end_implicit = end_implicit;
    (document->start_mark).index = 0;
    (document->start_mark).line = 0;
    (document->start_mark).column = 0;
    (document->end_mark).index = 0;
    (document->end_mark).line = 0;
    (document->end_mark).column = 0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

YAML_DECLARE(int)
yaml_document_initialize(yaml_document_t *document,
        yaml_version_directive_t *version_directive,
        yaml_tag_directive_t *tag_directives_start,
        yaml_tag_directive_t *tag_directives_end,
        int start_implicit, int end_implicit)
{
    struct {
        yaml_error_type_t error;
    } context;
    struct {
        yaml_node_t *start;
        yaml_node_t *end;
        yaml_node_t *top;
    } nodes = { NULL, NULL, NULL };
    yaml_version_directive_t *version_directive_copy = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives_copy = { NULL, NULL, NULL };
    yaml_tag_directive_t value = { NULL, NULL };
    yaml_mark_t mark = { 0, 0, 0 };

    assert(document);       /* Non-NULL document object is expected. */
    assert((tag_directives_start && tag_directives_end) ||
            (tag_directives_start == tag_directives_end));
                            /* Valid tag directives are expected. */

    if (!STACK_INIT(&context, nodes, yaml_node_t*)) goto error;

    if (version_directive) {
        version_directive_copy = YAML_MALLOC_STATIC(yaml_version_directive_t);
        if (!version_directive_copy) goto error;
        version_directive_copy->major = version_directive->major;
        version_directive_copy->minor = version_directive->minor;
    }

    if (tag_directives_start != tag_directives_end) {
        yaml_tag_directive_t *tag_directive;
        if (!STACK_INIT(&context, tag_directives_copy, yaml_tag_directive_t*))
            goto error;
        for (tag_directive = tag_directives_start;
                tag_directive != tag_directives_end; tag_directive ++) {
            assert(tag_directive->handle);
            assert(tag_directive->prefix);
            if (!yaml_check_utf8(tag_directive->handle,
                        strlen((char *)tag_directive->handle)))
                goto error;
            if (!yaml_check_utf8(tag_directive->prefix,
                        strlen((char *)tag_directive->prefix)))
                goto error;
            value.handle = yaml_strdup(tag_directive->handle);
            value.prefix = yaml_strdup(tag_directive->prefix);
            if (!value.handle || !value.prefix) goto error;
            if (!PUSH(&context, tag_directives_copy, value))
                goto error;
            value.handle = NULL;
            value.prefix = NULL;
        }
    }

    DOCUMENT_INIT(*document, nodes.start, nodes.end, version_directive_copy,
            tag_directives_copy.start, tag_directives_copy.top,
            start_implicit, end_implicit, mark, mark);

    return 1;

error:
    STACK_DEL(&context, nodes);
    yaml_free(version_directive_copy);
    while (!STACK_EMPTY(&context, tag_directives_copy)) {
        yaml_tag_directive_t value = POP(&context, tag_directives_copy);
        yaml_free(value.handle);
        yaml_free(value.prefix);
    }
    STACK_DEL(&context, tag_directives_copy);
    yaml_free(value.handle);
    yaml_free(value.prefix);

    return 0;
}